

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

bool __thiscall QDateTimeEdit::event(QDateTimeEdit *this,QEvent *event)

{
  undefined1 uVar1;
  short sVar2;
  QWidgetPrivate *this_00;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  sVar2 = *(short *)(event + 8);
  if (sVar2 == 100) {
    QWidgetPrivate::setLayoutItemMargins(this_00,SE_DateTimeEditLayoutItem,(QStyleOption *)0x0);
  }
  else if (sVar2 == 0x58) {
    (**(code **)(*(long *)this_00 + 0xc0))(this_00);
  }
  else if (sVar2 == 0x25) {
    uVar1 = this_00[2].field_0x49;
    local_48.d = *(Data **)&this_00[1].data.pal.currentGroup;
    local_48.ptr = *(char16_t **)&this_00[1].data.fnt;
    local_48.size = *(qsizetype *)&this_00[1].data.field_0x40;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::clear((QString *)&this_00[1].data.pal.currentGroup);
    setDisplayFormat(this,(QString *)&local_48);
    this_00[2].field_0x49 = uVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  bVar3 = QAbstractSpinBox::event((QAbstractSpinBox *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeEdit::event(QEvent *event)
{
    Q_D(QDateTimeEdit);
    switch (event->type()) {
    case QEvent::ApplicationLayoutDirectionChange: {
        const bool was = d->formatExplicitlySet;
        const QString oldFormat = d->displayFormat;
        d->displayFormat.clear();
        setDisplayFormat(oldFormat);
        d->formatExplicitlySet = was;
        break; }
    case QEvent::LocaleChange:
        d->updateEdit();
        break;
    case QEvent::StyleChange:
#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
        break;
    default:
        break;
    }
    return QAbstractSpinBox::event(event);
}